

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.c
# Opt level: O0

void reset_mem_pool(mem_pool **root,size_t target_used_mem)

{
  ulong local_28;
  size_t used_mem;
  mem_pool *cur;
  size_t target_used_mem_local;
  mem_pool **root_local;
  
  used_mem = (size_t)*root;
  local_28 = get_used_mem((mem_pool *)used_mem);
  do {
    if (*(long *)(used_mem + 0x10) == 0 || local_28 <= target_used_mem) {
LAB_00112412:
      *root = (mem_pool *)used_mem;
      return;
    }
    if (*(ulong *)used_mem < local_28 - target_used_mem) {
      *(ulong *)used_mem = *(long *)used_mem - (local_28 - target_used_mem);
      goto LAB_00112412;
    }
    local_28 = local_28 - *(long *)used_mem;
    *(undefined8 *)used_mem = 0;
    used_mem = *(size_t *)(used_mem + 0x10);
  } while( true );
}

Assistant:

void reset_mem_pool(struct mem_pool** root, size_t target_used_mem) {
    struct mem_pool* cur = *root;
    size_t used_mem = get_used_mem(cur);
    while (cur->prev && used_mem > target_used_mem) {
        if (used_mem - target_used_mem > cur->size) {
            cur->size -= used_mem - target_used_mem;
            break;
        } else {
            used_mem -= cur->size;
            cur->size = 0;
            cur = cur->prev;
        }
    }
    *root = cur;
}